

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
CoreTest_ToStringViewForeignStrings_Test::~CoreTest_ToStringViewForeignStrings_Test
          (CoreTest_ToStringViewForeignStrings_Test *this)

{
  void *in_RDI;
  
  ~CoreTest_ToStringViewForeignStrings_Test((CoreTest_ToStringViewForeignStrings_Test *)0x12c848);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(CoreTest, ToStringViewForeignStrings) {
  using namespace my_ns;
  using namespace FakeQt;
  EXPECT_EQ(to_string_view(my_string<char>("42")), "42");
  EXPECT_EQ(to_string_view(my_string<wchar_t>(L"42")), L"42");
  EXPECT_EQ(to_string_view(QString(L"42")), L"42");
  fmt::internal::type type =
      fmt::internal::get_type<fmt::format_context, my_string<char>>::value;
  EXPECT_EQ(type, fmt::internal::string_type);
  type =
      fmt::internal::get_type<fmt::wformat_context, my_string<wchar_t>>::value;
  EXPECT_EQ(type, fmt::internal::string_type);
  type = fmt::internal::get_type<fmt::wformat_context, QString>::value;
  EXPECT_EQ(type, fmt::internal::string_type);
  // Does not compile: only wide format contexts are compatible with QString!
  // type = fmt::internal::get_type<fmt::format_context, QString>::value;
}